

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomModel.pb.cc
# Opt level: O3

uint8_t * __thiscall
CoreML::Specification::CustomModel_CustomModelParamValue::_InternalSerialize
          (CustomModel_CustomModelParamValue *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  void *data;
  bool bVar2;
  uint8_t uVar3;
  uint32_t uVar4;
  undefined8 *puVar5;
  ulong uVar6;
  uint8_t *puVar7;
  ulong uVar8;
  int size;
  string *s;
  ulong uVar9;
  size_t __n;
  uint8_t *puVar10;
  ValueUnion VVar11;
  
  uVar4 = this->_oneof_case_[0];
  if (uVar4 == 10) {
    if (target < stream->end_) {
LAB_0031f3e8:
      VVar11 = this->value_;
    }
    else {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      VVar11.doublevalue_ = 0.0;
      if (this->_oneof_case_[0] == 10) goto LAB_0031f3e8;
    }
    *target = 'Q';
    *(ValueUnion *)(target + 1) = VVar11;
    target = target + 9;
    uVar4 = this->_oneof_case_[0];
  }
  if (uVar4 == 0x14) {
    puVar5 = (undefined8 *)((this->value_).longvalue_ & 0xfffffffffffffffe);
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar5,*(int *)(puVar5 + 1),SERIALIZE,
               "CoreML.Specification.CustomModel.CustomModelParamValue.stringValue");
    if (this->_oneof_case_[0] == 0x14) {
      s = (string *)((this->value_).longvalue_ & 0xfffffffffffffffe);
    }
    else {
      s = (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    }
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,0x14,s,target);
    uVar4 = this->_oneof_case_[0];
  }
  puVar10 = target;
  if (uVar4 == 0x1e) {
    if ((target < stream->end_) ||
       (target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target),
       this->_oneof_case_[0] == 0x1e)) {
      uVar1 = (this->value_).intvalue_;
      target[0] = 0xf0;
      target[1] = '\x01';
      target[2] = (byte)uVar1;
      if ((ulong)(long)(int)uVar1 < 0x80) goto LAB_0031f475;
      target[2] = (byte)uVar1 | 0x80;
      uVar6 = (ulong)(long)(int)uVar1 >> 7;
      target[3] = (uint8_t)uVar6;
      puVar10 = target + 4;
      if (0x3fff < uVar1) {
        uVar9 = (ulong)target[3];
        do {
          puVar10[-1] = (byte)uVar9 | 0x80;
          uVar8 = uVar6 >> 7;
          *puVar10 = (uint8_t)uVar8;
          puVar10 = puVar10 + 1;
          uVar9 = uVar8 & 0xffffffff;
          bVar2 = 0x3fff < uVar6;
          uVar6 = uVar8;
        } while (bVar2);
      }
    }
    else {
      target[0] = 0xf0;
      target[1] = '\x01';
      target[2] = '\0';
LAB_0031f475:
      puVar10 = target + 3;
    }
    uVar4 = this->_oneof_case_[0];
  }
  if (uVar4 == 0x28) {
    puVar7 = puVar10;
    if ((puVar10 < stream->end_) ||
       (puVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar10),
       this->_oneof_case_[0] == 0x28)) {
      VVar11 = this->value_;
      puVar7[0] = 0xc0;
      puVar7[1] = '\x02';
      puVar7[2] = VVar11.boolvalue_;
      if (0x7f < VVar11) {
        puVar7[2] = VVar11.boolvalue_ | 0x80;
        puVar7[3] = (uint8_t)((ulong)VVar11.longvalue_ >> 7);
        puVar10 = puVar7 + 4;
        if (0x3fff < VVar11) {
          uVar9 = (ulong)puVar7[3];
          uVar6 = (ulong)VVar11.longvalue_ >> 7;
          do {
            puVar10[-1] = (byte)uVar9 | 0x80;
            uVar8 = uVar6 >> 7;
            *puVar10 = (uint8_t)uVar8;
            puVar10 = puVar10 + 1;
            uVar9 = uVar8 & 0xffffffff;
            bVar2 = 0x3fff < uVar6;
            uVar6 = uVar8;
          } while (bVar2);
        }
        goto LAB_0031f4f2;
      }
    }
    else {
      puVar7[0] = 0xc0;
      puVar7[1] = '\x02';
      puVar7[2] = '\0';
    }
    puVar10 = puVar7 + 3;
  }
LAB_0031f4f2:
  uVar4 = this->_oneof_case_[0];
  if (uVar4 == 0x32) {
    if (puVar10 < stream->end_) {
      uVar3 = (this->value_).boolvalue_;
    }
    else {
      puVar10 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar10);
      uVar3 = '\0';
      if (this->_oneof_case_[0] == 0x32) {
        uVar3 = (uint8_t)(this->value_).intvalue_;
      }
    }
    puVar10[0] = 0x90;
    puVar10[1] = '\x03';
    puVar10[2] = uVar3;
    puVar10 = puVar10 + 3;
    uVar4 = this->_oneof_case_[0];
  }
  if (uVar4 == 0x3c) {
    puVar10 = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                        (stream,0x3c,(string *)((this->value_).longvalue_ & 0xfffffffffffffffe),
                         puVar10);
  }
  uVar6 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar6 & 1) != 0) {
    uVar6 = uVar6 & 0xfffffffffffffffc;
    data = *(void **)(uVar6 + 8);
    size = (int)*(undefined8 *)(uVar6 + 0x10);
    __n = (size_t)size;
    if ((long)stream->end_ - (long)puVar10 < (long)__n) {
      puVar10 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                          (stream,data,size,puVar10);
      return puVar10;
    }
    memcpy(puVar10,data,__n);
    puVar10 = puVar10 + __n;
  }
  return puVar10;
}

Assistant:

uint8_t* CustomModel_CustomModelParamValue::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.CustomModel.CustomModelParamValue)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // double doubleValue = 10;
  if (_internal_has_doublevalue()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteDoubleToArray(10, this->_internal_doublevalue(), target);
  }

  // string stringValue = 20;
  if (_internal_has_stringvalue()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_stringvalue().data(), static_cast<int>(this->_internal_stringvalue().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.CustomModel.CustomModelParamValue.stringValue");
    target = stream->WriteStringMaybeAliased(
        20, this->_internal_stringvalue(), target);
  }

  // int32 intValue = 30;
  if (_internal_has_intvalue()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(30, this->_internal_intvalue(), target);
  }

  // int64 longValue = 40;
  if (_internal_has_longvalue()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt64ToArray(40, this->_internal_longvalue(), target);
  }

  // bool boolValue = 50;
  if (_internal_has_boolvalue()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(50, this->_internal_boolvalue(), target);
  }

  // bytes bytesValue = 60;
  if (_internal_has_bytesvalue()) {
    target = stream->WriteBytesMaybeAliased(
        60, this->_internal_bytesvalue(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.CustomModel.CustomModelParamValue)
  return target;
}